

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O2

bool __thiscall axl::spy::ImportIterator::readRel(ImportIterator *this)

{
  ElfImportEnumeration *pEVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ElfRel *pEVar6;
  ulong uVar7;
  ElfRel *pEVar8;
  bool bVar9;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> SStack_48;
  
  pEVar1 = (this->m_enumeration).m_p;
  uVar2 = pEVar1->m_pltRelCount;
  uVar3 = this->m_index;
  do {
    uVar5 = uVar3;
    if (uVar3 < uVar2) {
      pEVar8 = pEVar1->m_pltRelTable + uVar2;
      pEVar6 = pEVar1->m_pltRelTable + uVar3;
      iVar4 = 7;
    }
    else {
      pEVar8 = pEVar1->m_gotRelTable + pEVar1->m_gotRelCount;
      pEVar6 = pEVar1->m_gotRelTable + (uVar3 - uVar2);
      iVar4 = 6;
    }
    for (; pEVar6 < pEVar8; pEVar6 = pEVar6 + 1) {
      if ((int)pEVar6->r_info == iVar4) {
        uVar7 = pEVar6->r_info >> 0x20;
        if (((pEVar1->m_symbolTable[uVar7].st_info & 0xf) == 2) &&
           (uVar7 = (ulong)pEVar1->m_symbolTable[uVar7].st_name, uVar7 < pEVar1->m_stringTableSize))
        {
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                    (&SStack_48,pEVar1->m_stringTable + uVar7);
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move
                    ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this,&SStack_48);
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&SStack_48);
          (this->super_ImportIteratorBase).m_slot =
               (void **)(pEVar6->r_offset + ((this->m_enumeration).m_p)->m_baseAddress);
          goto LAB_001264a2;
        }
      }
      this->m_index = uVar5 + 1;
      uVar5 = uVar5 + 1;
    }
    bVar9 = uVar2 <= uVar3;
    uVar3 = uVar5;
    if (bVar9) {
      ImportIteratorBase::reset(&this->super_ImportIteratorBase);
LAB_001264a2:
      return pEVar6 < pEVar8;
    }
  } while( true );
}

Assistant:

bool
ImportIterator::readRel() {
	ASSERT(m_enumeration && "attempt to read ElfRel from a null-iterator");

	int relType;
	ElfRel* rel;
	ElfRel* end;

	if (m_index < m_enumeration->m_pltRelCount) {
		relType = R_JUMP_SLOT;
		rel = m_enumeration->m_pltRelTable;
		end = rel + m_enumeration->m_pltRelCount;
		rel += m_index;
	} else {
		relType = R_GLOB_DAT;
		rel = m_enumeration->m_gotRelTable;
		end = rel + m_enumeration->m_gotRelCount;
		rel += m_index - m_enumeration->m_pltRelCount;
	}

	for (; rel < end; rel++, m_index++) {
		if (ELF_R_TYPE(rel->r_info) != relType)
			continue;

		size_t symIdx = ELF_R_SYM(rel->r_info);
		ElfW(Sym)* sym = m_enumeration->m_symbolTable + symIdx;
		if (ELF_ST_TYPE(sym->st_info) != STT_FUNC)
			continue;

		if (sym->st_name >= m_enumeration->m_stringTableSize) {
			AXL_TRACE("WARNING: ImportIterator::readRel: symbol out of string table\n");
			continue;
		}

		m_symbolName = m_enumeration->m_stringTable + sym->st_name;
		m_slot = (void**)(m_enumeration->m_baseAddress + rel->r_offset);
		return true;
	}

	if (relType == R_JUMP_SLOT)
		return readRel(); // retry with GOT

	reset();
	return false;
}